

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls_record.cc
# Opt level: O2

ssl_open_record_t __thiscall
bssl::dtls_open_record
          (bssl *this,SSL *ssl,uint8_t *out_type,DTLSRecordNumber *out_number,
          Span<unsigned_char> *out,size_t *out_consumed,uint8_t *out_alert,Span<unsigned_char> in)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  ushort *puVar4;
  RecordNumberEncrypter *pRVar5;
  SSLAEADContext *this_00;
  Span<const_unsigned_char> header;
  uint8_t *puVar6;
  DTLSRecordNumber num;
  uint8_t type;
  bool bVar7;
  uint16_t uVar8;
  uint16_t uVar9;
  int iVar10;
  uint uVar11;
  ssl_open_record_t sVar12;
  DTLSReadEpoch *pDVar13;
  uint64_t uVar14;
  uchar *puVar15;
  DTLSPrevReadEpoch *pDVar16;
  long lVar17;
  ushort uVar18;
  size_t len;
  ushort uVar20;
  size_t sVar21;
  size_t *psVar22;
  ushort epoch;
  Span<const_unsigned_char> in_00;
  OPENSSL_timeval OVar23;
  Span<unsigned_char> SVar24;
  uint8_t mask [2];
  CBS seq_bytes;
  CBS cbs;
  ParsedDTLSRecord record;
  CBS local_68;
  uint8_t *local_58;
  size_t sStack_50;
  uint8_t *local_48;
  size_t sStack_40;
  DTLSRecordNumber local_38;
  ulong uVar19;
  
  out->data_ = (uchar *)0x0;
  if (*(int *)(*(long *)(this + 0x30) + 0xac) == 1) {
    return ssl_open_record_close_notify;
  }
  if (in.data_ == (uchar *)0x0) {
    return ssl_open_record_partial;
  }
  record.type = '\0';
  record.version = 0;
  cbs.data = out_alert;
  cbs.len = (size_t)in.data_;
  record.read_epoch = (DTLSReadEpoch *)0x0;
  record.number.combined_ = 0;
  local_68.data = out_alert;
  local_68.len = (size_t)in.data_;
  psVar22 = out_consumed;
  iVar10 = CBS_get_u8(&cbs,&record.type);
  if (iVar10 == 0) goto LAB_00168634;
  if ((record.type & 0xe0) == 0x20) {
    if ((record.type & 0x10) != 0) goto LAB_00168634;
    uVar18 = *(ushort *)(*(long *)(this + 0x38) + 8);
    puVar4 = *(ushort **)(*(long *)(this + 0x38) + 0x90);
    if ((puVar4 != (ushort *)0x0) && (uVar3 = *puVar4, uVar18 <= uVar3)) {
      uVar18 = uVar3;
    }
    uVar20 = uVar18 & 0xfffc;
    uVar3 = uVar20 + (record.type & 3);
    epoch = (uVar20 - 4) + (record.type & 3);
    if (uVar3 <= uVar18) {
      epoch = uVar3;
    }
    if (uVar20 == 0) {
      epoch = uVar3;
    }
    len = 2 - (ulong)((record.type & 8) == 0);
    iVar10 = CBS_get_bytes(&cbs,&seq_bytes,len);
    if (iVar10 == 0) goto LAB_00168634;
    if ((record.type & 4) == 0) {
      iVar10 = CBS_get_bytes(&cbs,&record.body,cbs.len);
      if (iVar10 == 0) goto LAB_00168873;
    }
    else {
      iVar10 = CBS_get_u16_length_prefixed(&cbs,&record.body);
      if (iVar10 == 0) goto LAB_00168634;
    }
    if (*(long *)(*(long *)(this + 0x38) + 0x98) != 0) {
      OVar23 = ssl_ctx_get_current_time(*(SSL_CTX **)(this + 0x68));
      if (*(ulong *)(*(long *)(*(long *)(this + 0x38) + 0x98) + 0x88) < OVar23.tv_sec) {
        std::__uniq_ptr_impl<bssl::DTLSPrevReadEpoch,_bssl::internal::Deleter>::reset
                  ((__uniq_ptr_impl<bssl::DTLSPrevReadEpoch,_bssl::internal::Deleter> *)
                   (*(long *)(this + 0x38) + 0x98),(pointer)0x0);
      }
    }
    pDVar13 = dtls_get_read_epoch((SSL *)this,epoch);
    if ((pDVar13 != (DTLSReadEpoch *)0x0) &&
       (bVar7 = use_dtls13_record_header((SSL *)this,epoch), bVar7)) {
      pRVar5 = (pDVar13->rn_encrypter)._M_t.
               super___uniq_ptr_impl<bssl::RecordNumberEncrypter,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_bssl::RecordNumberEncrypter_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_bssl::RecordNumberEncrypter_*,_false>._M_head_impl;
      record.read_epoch = pDVar13;
      iVar10 = (*pRVar5->_vptr_RecordNumberEncrypter[4])
                         (pRVar5,mask,2,record.body.data,record.body.len);
      if ((char)iVar10 == '\0') goto LAB_00168634;
      uVar11 = 0;
      for (sVar21 = 0; seq_bytes.len != sVar21; sVar21 = sVar21 + 1) {
        bVar1 = seq_bytes.data[sVar21];
        bVar2 = mask[sVar21];
        seq_bytes.data[sVar21] = bVar1 ^ bVar2;
        uVar11 = (uint)(bVar1 ^ bVar2) | uVar11 << 8;
      }
      uVar14 = reconstruct_seqnum((uint16_t)uVar11,
                                  (ulong)(uint)~(-1 << ((byte)((int)len << 3) & 0x1f)),
                                  (pDVar13->bitmap).max_seq_num_);
      DTLSRecordNumber::DTLSRecordNumber(&local_38,epoch,uVar14);
      record.number.combined_ = local_38.combined_;
    }
  }
  else {
    iVar10 = CBS_get_u16(&cbs,&record.version);
    if (((iVar10 == 0) || (iVar10 = CBS_get_u64(&cbs,(uint64_t *)&seq_bytes), iVar10 == 0)) ||
       (iVar10 = CBS_get_u16_length_prefixed(&cbs,&record.body), uVar9 = record.version,
       puVar6 = seq_bytes.data, iVar10 == 0)) goto LAB_00168634;
    record.number.combined_ = (uint64_t)seq_bytes.data;
    if ((ulong)seq_bytes.data >> 0x30 == 0) {
      bVar7 = (record.version & 0xff00) == 0xfe00;
    }
    else {
      uVar8 = dtls_record_version((SSL *)this);
      bVar7 = uVar9 == uVar8;
    }
    if (!bVar7) goto LAB_00168634;
    uVar9 = (uint16_t)((ulong)puVar6 >> 0x30);
    if ((*(uint16_t *)(*(long *)(this + 0x38) + 8) == uVar9) &&
       (bVar7 = use_dtls13_record_header((SSL *)this,uVar9), !bVar7)) {
      record.read_epoch = (DTLSReadEpoch *)(*(long *)(this + 0x38) + 8);
    }
  }
  if (record.body.len < 0x4141) {
    iVar10 = CBS_get_bytes(&local_68,&record.header,(long)record.body.data - (long)local_68.data);
    if (iVar10 == 0) {
LAB_00168873:
      abort();
    }
    in_00.size_ = (size_t)psVar22;
    in_00.data_ = (uchar *)record.header.len;
    ssl_do_msg_callback(this,(SSL *)0x0,0x100,(int)record.header.data,in_00);
    num = record.number;
    pDVar13 = record.read_epoch;
    if ((record.read_epoch != (DTLSReadEpoch *)0x0) &&
       (bVar7 = DTLSReplayBitmap::ShouldDiscard
                          (&(record.read_epoch)->bitmap,record.number.combined_ & 0xffffffffffff),
       uVar9 = record.version, type = record.type, !bVar7)) {
      this_00 = (pDVar13->aead)._M_t.
                super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl;
      uVar14 = dtls_aead_sequence((SSL *)this,num);
      local_48 = record.header.data;
      sStack_40 = record.header.len;
      local_58 = record.body.data;
      sStack_50 = record.body.len;
      header.size_ = record.header.len;
      header.data_ = record.header.data;
      SVar24.size_ = record.body.len;
      SVar24.data_ = record.body.data;
      bVar7 = SSLAEADContext::Open
                        (this_00,(Span<unsigned_char> *)out_number,type,uVar9,uVar14,header,SVar24);
      if (bVar7) {
        out->data_ = in.data_ + -cbs.len;
        if ((((record.read_epoch)->aead)._M_t.
             super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl)->cipher_ ==
            (SSL_CIPHER *)0x0) {
          if (0x4000 < out_number[1].combined_) goto LAB_0016865c;
        }
        else {
          uVar9 = ssl_protocol_version((SSL *)this);
          uVar19 = out_number[1].combined_;
          if (0x4001 - (ulong)(uVar9 < 0x304) < uVar19) {
LAB_0016865c:
            ERR_put_error(0x10,0,0x88,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/dtls_record.cc"
                          ,0x15d);
            *(undefined1 *)out_consumed = 0x16;
            return ssl_open_record_error;
          }
          if (0x303 < uVar9) {
            do {
              if (uVar19 == 0) {
                ERR_put_error(0x10,0,0x8b,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/dtls_record.cc"
                              ,0x165);
                *(undefined1 *)out_consumed = 0x33;
                return ssl_open_record_error;
              }
              puVar15 = Span<unsigned_char>::back((Span<unsigned_char> *)out_number);
              record.type = *puVar15;
              SVar24 = Span<unsigned_char>::subspan
                                 ((Span<unsigned_char> *)out_number,0,out_number[1].combined_ - 1);
              uVar19 = SVar24.size_;
              *(Span<unsigned_char> *)out_number = SVar24;
            } while (record.type == '\0');
          }
        }
        DTLSReplayBitmap::Record
                  (&(record.read_epoch)->bitmap,record.number.combined_ & 0xffffffffffff);
        if (record.read_epoch == *(DTLSReadEpoch **)(*(long *)(this + 0x38) + 0x90)) {
          uVar9 = ssl_protocol_version((SSL *)this);
          if (uVar9 < 0x304) {
            __assert_fail("ssl_protocol_version(ssl) >= TLS1_3_VERSION",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/dtls_record.cc"
                          ,0x175,
                          "enum ssl_open_record_t bssl::dtls_open_record(SSL *, uint8_t *, DTLSRecordNumber *, Span<uint8_t> *, size_t *, uint8_t *, Span<uint8_t>)"
                         );
          }
          pDVar16 = New<bssl::DTLSPrevReadEpoch>();
          if (pDVar16 == (DTLSPrevReadEpoch *)0x0) {
            *(undefined1 *)out_consumed = 0x50;
            seq_bytes.data = (uint8_t *)0x0;
          }
          else {
            seq_bytes.data = (uint8_t *)pDVar16;
            OVar23 = ssl_ctx_get_current_time(*(SSL_CTX **)(this + 0x68));
            lVar17 = -1;
            if (OVar23.tv_sec < 0xffffffffffffff0f) {
              lVar17 = OVar23.tv_sec + 0xf0;
            }
            *(long *)(seq_bytes.data + 0x88) = lVar17;
            DTLSReadEpoch::operator=
                      ((DTLSReadEpoch *)seq_bytes.data,(DTLSReadEpoch *)(*(long *)(this + 0x38) + 8)
                      );
            puVar6 = seq_bytes.data;
            seq_bytes.data = (uint8_t *)0x0;
            std::__uniq_ptr_impl<bssl::DTLSPrevReadEpoch,_bssl::internal::Deleter>::reset
                      ((__uniq_ptr_impl<bssl::DTLSPrevReadEpoch,_bssl::internal::Deleter> *)
                       (*(long *)(this + 0x38) + 0x98),(pointer)puVar6);
            DTLSReadEpoch::operator=
                      ((DTLSReadEpoch *)(*(long *)(this + 0x38) + 8),
                       *(DTLSReadEpoch **)(*(long *)(this + 0x38) + 0x90));
            std::__uniq_ptr_impl<bssl::DTLSReadEpoch,_bssl::internal::Deleter>::reset
                      ((__uniq_ptr_impl<bssl::DTLSReadEpoch,_bssl::internal::Deleter> *)
                       (*(long *)(this + 0x38) + 0x90),(pointer)0x0);
          }
          std::unique_ptr<bssl::DTLSPrevReadEpoch,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<bssl::DTLSPrevReadEpoch,_bssl::internal::Deleter> *)&seq_bytes);
          if (pDVar16 == (DTLSPrevReadEpoch *)0x0) {
            return ssl_open_record_error;
          }
        }
        if (record.type == '\x15') {
          sVar12 = ssl_process_alert((SSL *)this,(uint8_t *)out_consumed,
                                     *(Span<const_unsigned_char> *)out_number);
          return sVar12;
        }
        if (record.type == '\x17') {
          if ((*(short *)(*(long *)(this + 0x30) + 0xd0) == 0) ||
             (uVar9 = ssl_protocol_version((SSL *)this), uVar9 < 0x304)) {
            if (record.number.combined_ < 0x1000000000000) goto LAB_00168827;
          }
          else if ((ushort)(record.number.combined_ >> 0x30) < 3 &&
                   (record.number.combined_ & 0xffff000000000000) != 0x1000000000000) {
LAB_00168827:
            ERR_put_error(0x10,0,0xe1,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/dtls_record.cc"
                          ,0x19e);
            *(undefined1 *)out_consumed = 10;
            return ssl_open_record_error;
          }
        }
        *(undefined1 *)(*(long *)(this + 0x30) + 0xd5) = 0;
        *(uint8_t *)&ssl->method = record.type;
        *(uint64_t *)out_type = record.number.combined_;
        return ssl_open_record_success;
      }
      ERR_clear_error();
    }
    in.data_ = in.data_ + -cbs.len;
  }
LAB_00168634:
  out->data_ = in.data_;
  return ssl_open_record_discard;
}

Assistant:

enum ssl_open_record_t dtls_open_record(SSL *ssl, uint8_t *out_type,
                                        DTLSRecordNumber *out_number,
                                        Span<uint8_t> *out,
                                        size_t *out_consumed,
                                        uint8_t *out_alert, Span<uint8_t> in) {
  *out_consumed = 0;
  if (ssl->s3->read_shutdown == ssl_shutdown_close_notify) {
    return ssl_open_record_close_notify;
  }

  if (in.empty()) {
    return ssl_open_record_partial;
  }

  CBS cbs(in);
  ParsedDTLSRecord record;
  if (!parse_dtls_record(ssl, &cbs, &record)) {
    // The record header was incomplete or malformed. Drop the entire packet.
    *out_consumed = in.size();
    return ssl_open_record_discard;
  }

  ssl_do_msg_callback(ssl, 0 /* read */, SSL3_RT_HEADER, record.header);

  if (record.read_epoch == nullptr ||
      record.read_epoch->bitmap.ShouldDiscard(record.number.sequence())) {
    // Drop this record. It's from an unknown epoch or is a replay. Note that if
    // the record is from next epoch, it could be buffered for later. For
    // simplicity, drop it and expect retransmit to handle it later; DTLS must
    // handle packet loss anyway.
    *out_consumed = in.size() - CBS_len(&cbs);
    return ssl_open_record_discard;
  }

  // Decrypt the body in-place.
  if (!record.read_epoch->aead->Open(out, record.type, record.version,
                                     dtls_aead_sequence(ssl, record.number),
                                     record.header,
                                     cbs_to_writable_bytes(record.body))) {
    // Bad packets are silently dropped in DTLS. See section 4.2.1 of RFC 6347.
    // Clear the error queue of any errors decryption may have added. Drop the
    // entire packet as it must not have come from the peer.
    //
    // TODO(davidben): This doesn't distinguish malloc failures from encryption
    // failures.
    ERR_clear_error();
    *out_consumed = in.size() - CBS_len(&cbs);
    return ssl_open_record_discard;
  }
  *out_consumed = in.size() - CBS_len(&cbs);

  // DTLS 1.3 hides the record type inside the encrypted data.
  bool has_padding = !record.read_epoch->aead->is_null_cipher() &&
                     ssl_protocol_version(ssl) >= TLS1_3_VERSION;
  // Check the plaintext length.
  size_t plaintext_limit = SSL3_RT_MAX_PLAIN_LENGTH + (has_padding ? 1 : 0);
  if (out->size() > plaintext_limit) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DATA_LENGTH_TOO_LONG);
    *out_alert = SSL_AD_RECORD_OVERFLOW;
    return ssl_open_record_error;
  }

  if (has_padding) {
    do {
      if (out->empty()) {
        OPENSSL_PUT_ERROR(SSL, SSL_R_DECRYPTION_FAILED_OR_BAD_RECORD_MAC);
        *out_alert = SSL_AD_DECRYPT_ERROR;
        return ssl_open_record_error;
      }
      record.type = out->back();
      *out = out->subspan(0, out->size() - 1);
    } while (record.type == 0);
  }

  record.read_epoch->bitmap.Record(record.number.sequence());

  // Once we receive a record from the next epoch in DTLS 1.3, it becomes the
  // current epoch. Also save the previous epoch. This allows us to handle
  // packet reordering on KeyUpdate, as well as ACK retransmissions of the
  // Finished flight.
  if (record.read_epoch == ssl->d1->next_read_epoch.get()) {
    assert(ssl_protocol_version(ssl) >= TLS1_3_VERSION);
    auto prev = MakeUnique<DTLSPrevReadEpoch>();
    if (prev == nullptr) {
      *out_alert = SSL_AD_INTERNAL_ERROR;
      return ssl_open_record_error;
    }

    // Release the epoch after a timeout.
    prev->expire = ssl_ctx_get_current_time(ssl->ctx.get()).tv_sec;
    if (prev->expire >= UINT64_MAX - DTLS_PREV_READ_EPOCH_EXPIRE_SECONDS) {
      prev->expire = UINT64_MAX;  // Saturate on overflow.
    } else {
      prev->expire += DTLS_PREV_READ_EPOCH_EXPIRE_SECONDS;
    }

    prev->epoch = std::move(ssl->d1->read_epoch);
    ssl->d1->prev_read_epoch = std::move(prev);
    ssl->d1->read_epoch = std::move(*ssl->d1->next_read_epoch);
    ssl->d1->next_read_epoch = nullptr;
  }

  // TODO(davidben): Limit the number of empty records as in TLS? This is only
  // useful if we also limit discarded packets.

  if (record.type == SSL3_RT_ALERT) {
    return ssl_process_alert(ssl, out_alert, *out);
  }

  // Reject application data in epochs that do not allow it.
  if (record.type == SSL3_RT_APPLICATION_DATA) {
    bool app_data_allowed;
    if (ssl->s3->version != 0 && ssl_protocol_version(ssl) >= TLS1_3_VERSION) {
      // Application data is allowed in 0-RTT (epoch 1) and after the handshake
      // (3 and up).
      app_data_allowed =
          record.number.epoch() == 1 || record.number.epoch() >= 3;
    } else {
      // Application data is allowed starting epoch 1.
      app_data_allowed = record.number.epoch() >= 1;
    }
    if (!app_data_allowed) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_UNEXPECTED_RECORD);
      *out_alert = SSL_AD_UNEXPECTED_MESSAGE;
      return ssl_open_record_error;
    }
  }

  ssl->s3->warning_alert_count = 0;

  *out_type = record.type;
  *out_number = record.number;
  return ssl_open_record_success;
}